

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::LineLoopCase::generateLines
          (LineLoopCase *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          *outLines)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  pointer pVVar9;
  pointer pSVar10;
  ulong uVar11;
  undefined8 uVar12;
  MessageBuilder *this_00;
  int vtxNdx;
  long lVar13;
  long lVar14;
  undefined1 local_1b0 [384];
  
  uVar11 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,4);
  if ((uint)iteration < 3) {
    fVar3 = *(float *)(&DAT_0181b804 + uVar11 * 4);
    fVar4 = *(float *)(&DAT_0181b810 + uVar11 * 4);
    fVar5 = *(float *)(&DAT_0181b858 + uVar11 * 4);
    fVar6 = *(float *)(&DAT_0181b81c + uVar11 * 4);
    fVar7 = *(float *)(&DAT_0181b870 + uVar11 * 4);
    fVar8 = *(float *)(&DAT_0181b828 + uVar11 * 4);
    pVVar9 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar9->m_data[0] = *(float *)(&DAT_0181b7f8 + uVar11 * 4);
    pVVar9->m_data[1] = fVar3;
    pVVar9->m_data[2] = 0.0;
    pVVar9->m_data[3] = 1.0;
    pVVar9 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar9[1].m_data[0] = fVar4;
    pVVar9[1].m_data[1] = fVar5;
    pVVar9[1].m_data[2] = 0.0;
    pVVar9[1].m_data[3] = 1.0;
    pVVar9 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar9[2].m_data[0] = fVar6;
    pVVar9[2].m_data[1] = fVar7;
    pVVar9[2].m_data[2] = 0.0;
    pVVar9[2].m_data[3] = 1.0;
    pVVar9 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar9[3].m_data[0] = fVar8;
    pVVar9[3].m_data[1] = 0.2;
    pVVar9[3].m_data[2] = 0.0;
    pVVar9[3].m_data[3] = 1.0;
  }
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::resize
            (outLines,4);
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9->m_data + 2);
  *(undefined8 *)pSVar10->positions[0].m_data = *(undefined8 *)pVVar9->m_data;
  *(undefined8 *)(pSVar10->positions[0].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9[1].m_data + 2);
  *(undefined8 *)pSVar10->positions[1].m_data = *(undefined8 *)pVVar9[1].m_data;
  *(undefined8 *)(pSVar10->positions[1].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9[1].m_data + 2);
  *(undefined8 *)pSVar10[1].positions[0].m_data = *(undefined8 *)pVVar9[1].m_data;
  *(undefined8 *)(pSVar10[1].positions[0].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9[2].m_data + 2);
  *(undefined8 *)pSVar10[1].positions[1].m_data = *(undefined8 *)pVVar9[2].m_data;
  *(undefined8 *)(pSVar10[1].positions[1].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9[2].m_data + 2);
  *(undefined8 *)pSVar10[2].positions[0].m_data = *(undefined8 *)pVVar9[2].m_data;
  *(undefined8 *)(pSVar10[2].positions[0].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9[3].m_data + 2);
  *(undefined8 *)pSVar10[2].positions[1].m_data = *(undefined8 *)pVVar9[3].m_data;
  *(undefined8 *)(pSVar10[2].positions[1].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9[3].m_data + 2);
  *(undefined8 *)pSVar10[3].positions[0].m_data = *(undefined8 *)pVVar9[3].m_data;
  *(undefined8 *)(pSVar10[3].positions[0].m_data + 2) = uVar12;
  pVVar9 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = *(undefined8 *)(pVVar9->m_data + 2);
  *(undefined8 *)pSVar10[3].positions[1].m_data = *(undefined8 *)pVVar9->m_data;
  *(undefined8 *)(pSVar10[3].positions[1].m_data + 2) = uVar12;
  local_1b0._0_8_ =
       ((this->super_BaseLineCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Rendering line loop, width = ");
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,
                       &(this->super_BaseLineCase).super_BaseRenderingCase.m_lineWidth);
  poVar1 = &this_00->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," vertices.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  lVar14 = 0;
  for (lVar13 = 0;
      lVar13 < (int)((ulong)((long)(outData->
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(outData->
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar13 = lVar13 + 1) {
    local_1b0._0_8_ =
         ((this->super_BaseLineCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"\t");
    tcu::operator<<((ostream *)poVar2,
                    (Vector<float,_4> *)
                    ((long)((outData->
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    lVar14 = lVar14 + 0x10;
  }
  return;
}

Assistant:

void LineLoopCase::generateLines (int iteration, std::vector<tcu::Vec4>& outData, std::vector<LineSceneSpec::SceneLine>& outLines)
{
	outData.resize(4);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.01f,  0.0f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,   0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.46f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,   0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.7f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4( 0.11f,  0.2f, 0.0f, 1.0f);
			break;
	}

	outLines.resize(4);
	outLines[0].positions[0] = outData[0];
	outLines[0].positions[1] = outData[1];
	outLines[1].positions[0] = outData[1];
	outLines[1].positions[1] = outData[2];
	outLines[2].positions[0] = outData[2];
	outLines[2].positions[1] = outData[3];
	outLines[3].positions[0] = outData[3];
	outLines[3].positions[1] = outData[0];

	// log
	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering line loop, width = " << m_lineWidth << ", " << outData.size() << " vertices." << tcu::TestLog::EndMessage;
	for (int vtxNdx = 0; vtxNdx < (int)outData.size(); ++vtxNdx)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "\t" << outData[vtxNdx]
			<< tcu::TestLog::EndMessage;
	}
}